

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# salsa20.cpp
# Opt level: O0

block_array * __thiscall
salsa20::generate_keystream(block_array *__return_storage_ptr__,salsa20 *this)

{
  value_type_conflict vVar1;
  uint32_t uVar2;
  reference pvVar3;
  long lVar4;
  iterator __first;
  iterator __last;
  iterator pvVar5;
  uint64_t *position;
  unsigned_long result_start_index;
  ulong uStack_68;
  array<unsigned_char,_4UL> converted;
  size_t i_1;
  long local_58;
  size_t i;
  array<unsigned_int,_16UL> x;
  salsa20 *this_local;
  
  x._M_elems._56_8_ = this;
  memcpy(&i,this,0x40);
  for (local_58 = 0x14; local_58 != 0; local_58 = local_58 + -1) {
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0);
    vVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0xc);
    uVar2 = rotate(this,vVar1 + *pvVar3,7);
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,4);
    *pvVar3 = uVar2 ^ *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,4);
    vVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0);
    uVar2 = rotate(this,vVar1 + *pvVar3,9);
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,8);
    *pvVar3 = uVar2 ^ *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,8);
    vVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,4);
    uVar2 = rotate(this,vVar1 + *pvVar3,0xd);
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0xc);
    *pvVar3 = uVar2 ^ *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0xc);
    vVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,8);
    uVar2 = rotate(this,vVar1 + *pvVar3,0x12);
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0);
    *pvVar3 = uVar2 ^ *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,5);
    vVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,1);
    uVar2 = rotate(this,vVar1 + *pvVar3,7);
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,9);
    *pvVar3 = uVar2 ^ *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,9);
    vVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,5);
    uVar2 = rotate(this,vVar1 + *pvVar3,9);
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0xd);
    *pvVar3 = uVar2 ^ *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0xd);
    vVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,9);
    uVar2 = rotate(this,vVar1 + *pvVar3,0xd);
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,1);
    *pvVar3 = uVar2 ^ *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,1);
    vVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0xd);
    uVar2 = rotate(this,vVar1 + *pvVar3,0x12);
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,5);
    *pvVar3 = uVar2 ^ *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,10);
    vVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,6);
    uVar2 = rotate(this,vVar1 + *pvVar3,7);
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0xe);
    *pvVar3 = uVar2 ^ *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0xe);
    vVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,10);
    uVar2 = rotate(this,vVar1 + *pvVar3,9);
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,2);
    *pvVar3 = uVar2 ^ *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,2);
    vVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0xe);
    uVar2 = rotate(this,vVar1 + *pvVar3,0xd);
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,6);
    *pvVar3 = uVar2 ^ *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,6);
    vVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,2);
    uVar2 = rotate(this,vVar1 + *pvVar3,0x12);
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,10);
    *pvVar3 = uVar2 ^ *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0xf);
    vVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0xb);
    uVar2 = rotate(this,vVar1 + *pvVar3,7);
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,3);
    *pvVar3 = uVar2 ^ *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,3);
    vVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0xf);
    uVar2 = rotate(this,vVar1 + *pvVar3,9);
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,7);
    *pvVar3 = uVar2 ^ *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,7);
    vVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,3);
    uVar2 = rotate(this,vVar1 + *pvVar3,0xd);
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0xb);
    *pvVar3 = uVar2 ^ *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0xb);
    vVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,7);
    uVar2 = rotate(this,vVar1 + *pvVar3,0x12);
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0xf);
    *pvVar3 = uVar2 ^ *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0);
    vVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,3);
    uVar2 = rotate(this,vVar1 + *pvVar3,7);
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,1);
    *pvVar3 = uVar2 ^ *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,1);
    vVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0);
    uVar2 = rotate(this,vVar1 + *pvVar3,9);
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,2);
    *pvVar3 = uVar2 ^ *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,2);
    vVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,1);
    uVar2 = rotate(this,vVar1 + *pvVar3,0xd);
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,3);
    *pvVar3 = uVar2 ^ *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,3);
    vVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,2);
    uVar2 = rotate(this,vVar1 + *pvVar3,0x12);
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0);
    *pvVar3 = uVar2 ^ *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,5);
    vVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,4);
    uVar2 = rotate(this,vVar1 + *pvVar3,7);
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,6);
    *pvVar3 = uVar2 ^ *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,6);
    vVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,5);
    uVar2 = rotate(this,vVar1 + *pvVar3,9);
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,7);
    *pvVar3 = uVar2 ^ *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,7);
    vVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,6);
    uVar2 = rotate(this,vVar1 + *pvVar3,0xd);
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,4);
    *pvVar3 = uVar2 ^ *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,4);
    vVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,7);
    uVar2 = rotate(this,vVar1 + *pvVar3,0x12);
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,5);
    *pvVar3 = uVar2 ^ *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,10);
    vVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,9);
    uVar2 = rotate(this,vVar1 + *pvVar3,7);
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0xb);
    *pvVar3 = uVar2 ^ *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0xb);
    vVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,10);
    uVar2 = rotate(this,vVar1 + *pvVar3,9);
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,8);
    *pvVar3 = uVar2 ^ *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,8);
    vVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0xb);
    uVar2 = rotate(this,vVar1 + *pvVar3,0xd);
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,9);
    *pvVar3 = uVar2 ^ *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,9);
    vVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,8);
    uVar2 = rotate(this,vVar1 + *pvVar3,0x12);
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,10);
    *pvVar3 = uVar2 ^ *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0xf);
    vVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0xe);
    uVar2 = rotate(this,vVar1 + *pvVar3,7);
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0xc);
    *pvVar3 = uVar2 ^ *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0xc);
    vVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0xf);
    uVar2 = rotate(this,vVar1 + *pvVar3,9);
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0xd);
    *pvVar3 = uVar2 ^ *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0xd);
    vVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0xc);
    uVar2 = rotate(this,vVar1 + *pvVar3,0xd);
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0xe);
    *pvVar3 = uVar2 ^ *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0xe);
    vVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0xd);
    uVar2 = rotate(this,vVar1 + *pvVar3,0x12);
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0xf);
    *pvVar3 = uVar2 ^ *pvVar3;
  }
  i_1._7_1_ = 0;
  std::array<unsigned_char,_64UL>::fill
            (__return_storage_ptr__,(value_type_conflict1 *)((long)&i_1 + 7));
  for (uStack_68 = 0; uStack_68 < 0x10; uStack_68 = uStack_68 + 1) {
    pvVar3 = std::array<unsigned_int,_16UL>::operator[](&this->m_array,uStack_68);
    vVar1 = *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,uStack_68);
    *pvVar3 = vVar1 + *pvVar3;
    pvVar3 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,uStack_68);
    result_start_index._4_4_ = convert(this,*pvVar3);
    lVar4 = uStack_68 * 4;
    __first = std::array<unsigned_char,_4UL>::begin
                        ((array<unsigned_char,_4UL> *)((long)&result_start_index + 4));
    __last = std::array<unsigned_char,_4UL>::end
                       ((array<unsigned_char,_4UL> *)((long)&result_start_index + 4));
    pvVar5 = std::array<unsigned_char,_64UL>::begin(__return_storage_ptr__);
    std::copy<unsigned_char*,unsigned_char*>(__first,__last,pvVar5 + lVar4);
  }
  pvVar3 = std::array<unsigned_int,_16UL>::operator[](&this->m_array,8);
  *(long *)pvVar3 = *(long *)pvVar3 + 1;
  return __return_storage_ptr__;
}

Assistant:

salsa20::block_array salsa20::generate_keystream()
{
    auto x = m_array;

    for (size_t i = 20; i > 0; --i)
    {
        x[4 ] ^= rotate(static_cast<uint32_t>(x[0 ] + x[12]), 7);
        x[8 ] ^= rotate(static_cast<uint32_t>(x[4 ] + x[0 ]), 9);
        x[12] ^= rotate(static_cast<uint32_t>(x[8 ] + x[4 ]), 13);
        x[0 ] ^= rotate(static_cast<uint32_t>(x[12] + x[8 ]), 18);

        x[9 ] ^= rotate(static_cast<uint32_t>(x[5 ] + x[1 ]), 7);
        x[13] ^= rotate(static_cast<uint32_t>(x[9 ] + x[5 ]), 9);
        x[1 ] ^= rotate(static_cast<uint32_t>(x[13] + x[9 ]), 13);
        x[5 ] ^= rotate(static_cast<uint32_t>(x[1 ] + x[13]), 18);

        x[14] ^= rotate(static_cast<uint32_t>(x[10] + x[6 ]), 7);
        x[2 ] ^= rotate(static_cast<uint32_t>(x[14] + x[10]), 9);
        x[6 ] ^= rotate(static_cast<uint32_t>(x[2 ] + x[14]), 13);
        x[10] ^= rotate(static_cast<uint32_t>(x[6 ] + x[2 ]), 18);

        x[3 ] ^= rotate(static_cast<uint32_t>(x[15] + x[11]), 7);
        x[7 ] ^= rotate(static_cast<uint32_t>(x[3 ] + x[15]), 9);
        x[11] ^= rotate(static_cast<uint32_t>(x[7 ] + x[3 ]), 13);
        x[15] ^= rotate(static_cast<uint32_t>(x[11] + x[7 ]), 18);

        x[1 ] ^= rotate(static_cast<uint32_t>(x[0 ] + x[3 ]), 7);
        x[2 ] ^= rotate(static_cast<uint32_t>(x[1 ] + x[0 ]), 9);
        x[3 ] ^= rotate(static_cast<uint32_t>(x[2 ] + x[1 ]), 13);
        x[0 ] ^= rotate(static_cast<uint32_t>(x[3 ] + x[2 ]), 18);

        x[6 ] ^= rotate(static_cast<uint32_t>(x[5 ] + x[4 ]), 7);
        x[7 ] ^= rotate(static_cast<uint32_t>(x[6 ] + x[5 ]), 9);
        x[4 ] ^= rotate(static_cast<uint32_t>(x[7 ] + x[6 ]), 13);
        x[5 ] ^= rotate(static_cast<uint32_t>(x[4 ] + x[7 ]), 18);

        x[11] ^= rotate(static_cast<uint32_t>(x[10] + x[9 ]), 7);
        x[8 ] ^= rotate(static_cast<uint32_t>(x[11] + x[10]), 9);
        x[9 ] ^= rotate(static_cast<uint32_t>(x[8 ] + x[11]), 13);
        x[10] ^= rotate(static_cast<uint32_t>(x[9 ] + x[8 ]), 18);

        x[12] ^= rotate(static_cast<uint32_t>(x[15] + x[14]), 7);
        x[13] ^= rotate(static_cast<uint32_t>(x[12] + x[15]), 9);
        x[14] ^= rotate(static_cast<uint32_t>(x[13] + x[12]), 13);
        x[15] ^= rotate(static_cast<uint32_t>(x[14] + x[13]), 18);
    }

    std::array<uint8_t, sizes::block_size> result;
    result.fill(0x0);

    for (size_t i = 0; i < sizes::key_array_size; ++i)
    {
        x[i] += m_array[i];

        auto converted = convert(x[i]);
        auto result_start_index = i * sizeof (uint32_t);

        std::copy(converted.begin(), converted.end(), result.begin() + result_start_index);
    }

    auto position = reinterpret_cast<uint64_t *>(&m_array[8]);

    // ++*position - beeeee
    *position = *position + 1;

    return result;
}